

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O1

TxSetType av1_get_ext_tx_set_type(TX_SIZE tx_size,int is_inter,int use_reduced_set)

{
  uint uVar1;
  
  uVar1 = (uint)tx_size;
  if ((0x61810UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    return '\0';
  }
  if ((0x18608UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
    if (use_reduced_set != 0) {
      return (is_inter == 0) + '\x01';
    }
    return av1_ext_tx_set_lookup[(uint)is_inter][(0x60604UL >> ((ulong)uVar1 & 0x3f) & 1) != 0];
  }
  return is_inter != 0;
}

Assistant:

static inline TxSetType av1_get_ext_tx_set_type(TX_SIZE tx_size, int is_inter,
                                                int use_reduced_set) {
  const TX_SIZE tx_size_sqr_up = txsize_sqr_up_map[tx_size];
  if (tx_size_sqr_up > TX_32X32) return EXT_TX_SET_DCTONLY;
  if (tx_size_sqr_up == TX_32X32)
    return is_inter ? EXT_TX_SET_DCT_IDTX : EXT_TX_SET_DCTONLY;
  if (use_reduced_set)
    return is_inter ? EXT_TX_SET_DCT_IDTX : EXT_TX_SET_DTT4_IDTX;
  const TX_SIZE tx_size_sqr = txsize_sqr_map[tx_size];
  return av1_ext_tx_set_lookup[is_inter][tx_size_sqr == TX_16X16];
}